

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::cmMakefileTargetGenerator
          (cmMakefileTargetGenerator *this,cmGeneratorTarget *target)

{
  _Rb_tree_header *p_Var1;
  cmGlobalUnixMakefileGenerator3 *pcVar2;
  cmake *pcVar3;
  cmState *this_00;
  MacOSXContentGeneratorType *pMVar4;
  bool bVar5;
  PolicyStatus PVar6;
  cmLocalUnixMakefileGenerator3 *pcVar7;
  cmValue cVar8;
  MacOSXContentGeneratorType *pMVar9;
  string_view value;
  string local_50;
  
  cmCommonTargetGenerator::cmCommonTargetGenerator(&this->super_cmCommonTargetGenerator,target);
  (this->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator =
       (_func_int **)&PTR__cmMakefileTargetGenerator_00aac530;
  (this->BuildFileName)._M_dataplus._M_p = (pointer)&(this->BuildFileName).field_2;
  (this->BuildFileName)._M_string_length = 0;
  (this->BuildFileName).field_2._M_local_buf[0] = '\0';
  (this->BuildFileNameFull)._M_dataplus._M_p = (pointer)&(this->BuildFileNameFull).field_2;
  (this->BuildFileNameFull)._M_string_length = 0;
  (this->BuildFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->ProgressFileNameFull)._M_dataplus._M_p = (pointer)&(this->ProgressFileNameFull).field_2;
  (this->ProgressFileNameFull)._M_string_length = 0;
  (this->ProgressFileNameFull).field_2._M_local_buf[0] = '\0';
  this->CMP0113New = false;
  (this->TargetBuildDirectory)._M_dataplus._M_p = (pointer)&(this->TargetBuildDirectory).field_2;
  (this->TargetBuildDirectory)._M_string_length = 0;
  (this->TargetBuildDirectory).field_2._M_local_buf[0] = '\0';
  (this->TargetBuildDirectoryFull)._M_dataplus._M_p =
       (pointer)&(this->TargetBuildDirectoryFull).field_2;
  (this->TargetBuildDirectoryFull)._M_string_length = 0;
  (this->TargetBuildDirectoryFull).field_2._M_local_buf[0] = '\0';
  (this->BuildFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  (this->FlagFileNameFull)._M_dataplus._M_p = (pointer)&(this->FlagFileNameFull).field_2;
  (this->FlagFileNameFull)._M_string_length = 0;
  (this->FlagFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->FlagFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  p_Var1 = &(this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->FlagFileDepends)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->InfoFileNameFull)._M_dataplus._M_p = (pointer)&(this->InfoFileNameFull).field_2;
  (this->InfoFileNameFull)._M_string_length = 0;
  (this->InfoFileNameFull).field_2._M_local_buf[0] = '\0';
  (this->InfoFileStream)._M_t.
  super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl = (cmGeneratedFileStream *)0x0;
  p_Var1 = &(this->CleanFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExternalObjects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CleanFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->Objects).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ObjectFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ExtraFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->CustomCommandOutputs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MultipleOutputPairs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->TargetNames).Base._M_dataplus._M_p = (pointer)&(this->TargetNames).Base.field_2;
  (this->TargetNames).Base._M_string_length = 0;
  (this->TargetNames).Base.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).Output._M_dataplus._M_p = (pointer)&(this->TargetNames).Output.field_2;
  (this->TargetNames).Output._M_string_length = 0;
  (this->TargetNames).Output.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).Real._M_dataplus._M_p = (pointer)&(this->TargetNames).Real.field_2;
  (this->TargetNames).Real._M_string_length = 0;
  (this->TargetNames).Real.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).ImportOutput._M_dataplus._M_p =
       (pointer)&(this->TargetNames).ImportOutput.field_2;
  (this->TargetNames).ImportOutput._M_string_length = 0;
  (this->TargetNames).ImportOutput.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).ImportReal._M_dataplus._M_p = (pointer)&(this->TargetNames).ImportReal.field_2
  ;
  (this->TargetNames).ImportReal._M_string_length = 0;
  (this->TargetNames).ImportReal.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).ImportLibrary._M_dataplus._M_p =
       (pointer)&(this->TargetNames).ImportLibrary.field_2;
  (this->TargetNames).ImportLibrary._M_string_length = 0;
  (this->TargetNames).ImportLibrary.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).PDB._M_dataplus._M_p = (pointer)&(this->TargetNames).PDB.field_2;
  (this->TargetNames).PDB._M_string_length = 0;
  (this->TargetNames).PDB.field_2._M_local_buf[0] = '\0';
  (this->TargetNames).SharedObject._M_dataplus._M_p =
       (pointer)&(this->TargetNames).SharedObject.field_2;
  (this->TargetNames).SharedObject._M_string_length = 0;
  (this->TargetNames).SharedObject.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->CustomCommandDriver = OnBuild;
  (this->MacOSXContentGenerator)._M_t.
  super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
  _M_head_impl = (MacOSXContentGeneratorType *)0x0;
  (this->MacContentFolders)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->OSXBundleGenerator)._M_t.
  super___uniq_ptr_impl<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmOSXBundleGenerator_*,_std::default_delete<cmOSXBundleGenerator>_>.
  super__Head_base<0UL,_cmOSXBundleGenerator_*,_false>._M_head_impl = (cmOSXBundleGenerator *)0x0;
  pcVar7 = (cmLocalUnixMakefileGenerator3 *)cmGeneratorTarget::GetLocalGenerator(target);
  this->LocalGenerator = pcVar7;
  pcVar2 = (cmGlobalUnixMakefileGenerator3 *)
           (pcVar7->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator;
  this->GlobalGenerator = pcVar2;
  pcVar3 = (pcVar2->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance;
  this->NoRuleMessages = false;
  this_00 = (pcVar3->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
            super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"RULE_MESSAGES","");
  cVar8 = cmState::GetGlobalProperty(this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (cVar8.Value != (string *)0x0) {
    value._M_str = ((cVar8.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar8.Value)->_M_string_length;
    bVar5 = cmValue::IsOff(value);
    this->NoRuleMessages = bVar5;
  }
  PVar6 = cmPolicies::PolicyMap::Get
                    (&((this->super_cmCommonTargetGenerator).GeneratorTarget)->PolicyMap,CMP0113);
  if (PVar6 < (REQUIRED_ALWAYS|WARN)) {
    this->CMP0113New = SUB81(0x101010000 >> ((byte)(PVar6 << 3) & 0x3f),0);
  }
  pMVar9 = (MacOSXContentGeneratorType *)operator_new(0x10);
  (pMVar9->super_MacOSXContentGeneratorType)._vptr_MacOSXContentGeneratorType =
       (_func_int **)&PTR__MacOSXContentGeneratorType_00aac578;
  pMVar9->Generator = this;
  pMVar4 = (this->MacOSXContentGenerator)._M_t.
           super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
           .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
           _M_head_impl;
  (this->MacOSXContentGenerator)._M_t.
  super___uniq_ptr_impl<cmMakefileTargetGenerator::MacOSXContentGeneratorType,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_std::default_delete<cmMakefileTargetGenerator::MacOSXContentGeneratorType>_>
  .super__Head_base<0UL,_cmMakefileTargetGenerator::MacOSXContentGeneratorType_*,_false>.
  _M_head_impl = pMVar9;
  if (pMVar4 != (MacOSXContentGeneratorType *)0x0) {
    (*(pMVar4->super_MacOSXContentGeneratorType)._vptr_MacOSXContentGeneratorType[1])();
  }
  return;
}

Assistant:

cmMakefileTargetGenerator::cmMakefileTargetGenerator(cmGeneratorTarget* target)
  : cmCommonTargetGenerator(target)
{
  this->CustomCommandDriver = OnBuild;
  this->LocalGenerator =
    static_cast<cmLocalUnixMakefileGenerator3*>(target->GetLocalGenerator());
  this->GlobalGenerator = static_cast<cmGlobalUnixMakefileGenerator3*>(
    this->LocalGenerator->GetGlobalGenerator());
  cmake* cm = this->GlobalGenerator->GetCMakeInstance();
  this->NoRuleMessages = false;
  if (cmValue ruleStatus =
        cm->GetState()->GetGlobalProperty("RULE_MESSAGES")) {
    this->NoRuleMessages = ruleStatus.IsOff();
  }
  switch (this->GeneratorTarget->GetPolicyStatusCMP0113()) {
    case cmPolicies::WARN:
      CM_FALLTHROUGH;
    case cmPolicies::OLD:
      this->CMP0113New = false;
      break;
    case cmPolicies::NEW:
    case cmPolicies::REQUIRED_IF_USED:
    case cmPolicies::REQUIRED_ALWAYS:
      this->CMP0113New = true;
      break;
  }
  this->MacOSXContentGenerator =
    cm::make_unique<MacOSXContentGeneratorType>(this);
}